

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::fill<fmt::v8::appender,char>(appender it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  appender aVar2;
  bool bVar3;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    aVar2 = fill_n<fmt::v8::appender,unsigned_long,char>(it,n,fill->data_);
    return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    buffer<char>::append<char>
              ((buffer<char> *)
               it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,fill->data_,
               fill->data_ + bVar1);
  }
  return (appender)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container
  ;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}